

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O3

int read_single_rle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              uint address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,Dwarf_Error *error)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  Dwarf_Signed errval;
  char *pcVar4;
  ulong uVar5;
  Dwarf_Small *pDVar6;
  char *pcVar7;
  char *local_68;
  char *local_60;
  dwarfstring_s local_58;
  Dwarf_Small *local_38;
  
  if (enddata <= data) {
    pcVar3 = 
    "DW_DLE_RNGLISTS_ERROR: An rle entry begins past the end of its allowed space. Corrupt DWARF.";
    errval = 0x1d4;
    goto LAB_0017f8cc;
  }
  bVar1 = *data;
  pcVar3 = (char *)(ulong)bVar1;
  if (7 < bVar1) {
    dwarfstring_constructor(&local_58);
    dwarfstring_append_printf_u
              (&local_58,
               "DW_DLE_RNGLISTS_ERROR: The rangelists entry at .debug_rnglists offset 0x%x",
               dataoffset);
    dwarfstring_append_printf_u(&local_58," has code 0x%x which is unknown",(ulong)(uint)bVar1);
    pcVar3 = dwarfstring_string(&local_58);
    _dwarf_error_string(dbg,error,0x1d4,pcVar3);
    dwarfstring_destructor(&local_58);
    return 1;
  }
  pDVar6 = data + 1;
  switch(pcVar3) {
  case (char *)0x0:
    pcVar4 = (char *)0x1;
    pcVar7 = pcVar3;
    break;
  case (char *)0x1:
    local_58.s_data = (char *)0x0;
    local_68 = (char *)0x0;
    iVar2 = dwarf_decode_leb128((char *)pDVar6,(Dwarf_Unsigned *)&local_58,
                                (Dwarf_Unsigned *)&local_68,(char *)enddata);
    if (iVar2 == 1) {
LAB_0017f698:
      pcVar3 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
      errval = 0x149;
      goto LAB_0017f8cc;
    }
    pDVar6 = pDVar6 + (long)local_58.s_data;
    pcVar3 = (char *)0x0;
    pcVar7 = local_68;
    pcVar4 = local_58.s_data;
LAB_0017f88e:
    pcVar4 = pcVar4 + 1;
    break;
  default:
    local_58.s_data = (char *)0x0;
    local_68 = (char *)0x0;
    iVar2 = dwarf_decode_leb128((char *)pDVar6,(Dwarf_Unsigned *)&local_58,
                                (Dwarf_Unsigned *)&local_68,(char *)enddata);
    if (iVar2 == 1) goto LAB_0017f698;
    local_60 = local_68;
    pDVar6 = pDVar6 + (long)local_58.s_data;
    pcVar3 = local_58.s_data;
LAB_0017f6ff:
    local_58.s_data = (char *)0x0;
    local_68 = (char *)0x0;
    iVar2 = dwarf_decode_leb128((char *)pDVar6,(Dwarf_Unsigned *)&local_58,
                                (Dwarf_Unsigned *)&local_68,(char *)enddata);
    if (iVar2 == 1) {
      pcVar3 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
      errval = 0x149;
      goto LAB_0017f8cc;
    }
    pcVar4 = pcVar3 + (long)local_58.s_data + 1;
    pcVar3 = local_68;
    pDVar6 = pDVar6 + (long)local_58.s_data;
    pcVar7 = local_60;
    break;
  case (char *)0x5:
    local_58.s_data = (char *)0x0;
    uVar5 = (ulong)address_size;
    if (enddata < pDVar6 + uVar5) goto LAB_0017f7e1;
    (*dbg->de_copy_word)(&local_58,pDVar6,uVar5);
    pcVar4 = (char *)(uVar5 + 1);
    pcVar3 = (char *)0x0;
    pDVar6 = pDVar6 + uVar5;
    pcVar7 = local_58.s_data;
    break;
  case (char *)0x6:
    local_58.s_data = (char *)0x0;
    uVar5 = (ulong)address_size;
    if (pDVar6 + uVar5 <= enddata) {
      local_38 = pDVar6 + uVar5;
      (*dbg->de_copy_word)(&local_58,pDVar6,uVar5);
      pcVar3 = local_58.s_data;
      local_58.s_data = (char *)0x0;
      pDVar6 = local_38 + uVar5;
      if (pDVar6 <= enddata) {
        local_60 = pcVar3;
        (*dbg->de_copy_word)(&local_58,local_38,uVar5);
        pcVar3 = local_58.s_data;
        pcVar7 = local_60;
        pcVar4 = (char *)(uVar5 * 2);
        goto LAB_0017f88e;
      }
    }
    goto LAB_0017f7e1;
  case (char *)0x7:
    local_58.s_data = (char *)0x0;
    pcVar3 = (char *)(ulong)address_size;
    local_38 = (Dwarf_Small *)(pcVar3 + (long)pDVar6);
    if (local_38 <= enddata) {
      (*dbg->de_copy_word)(&local_58,pDVar6,(unsigned_long)pcVar3);
      local_60 = local_58.s_data;
      pDVar6 = local_38;
      goto LAB_0017f6ff;
    }
LAB_0017f7e1:
    local_58.s_data = (char *)0x0;
    pcVar3 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
    errval = 0x14b;
    goto LAB_0017f8cc;
  }
  if (enddata < pDVar6 || pDVar6 < data) {
    pcVar3 = "DW_DLE_RNGLISTS_ERROR: The end of an rle entry is past the end of its allowed space";
  }
  else {
    if (pcVar4 <= (char *)(dbg->de_debug_rnglists).dss_size) {
      *bytes_count_out = (uint)pcVar4;
      *entry_kind = (uint)bVar1;
      *entry_operand1 = (Dwarf_Unsigned)pcVar7;
      *entry_operand2 = (Dwarf_Unsigned)pcVar3;
      return 0;
    }
    pcVar3 = 
    "DW_DLE_RNGLISTS_ERROR: The number of bytes in a single rnglist entry is too large to be reasonable"
    ;
  }
  errval = 0x1d4;
LAB_0017f8cc:
  _dwarf_error_string(dbg,error,errval,pcVar3);
  return 1;
}

Assistant:

static int
read_single_rle_entry(Dwarf_Debug dbg,
    Dwarf_Small   *data,
    Dwarf_Unsigned dataoffset,
    Dwarf_Small   *enddata,
    unsigned       address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Small *  startdata = 0;

    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            "DW_DLE_RNGLISTS_ERROR: "
            "An rle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_RLE_end_of_list: break;
    case DW_RLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_startx_endx:
    case DW_RLE_startx_length:
    case DW_RLE_offset_pair: {
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_end: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_length: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    default: {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_RNGLISTS_ERROR: "
            "The rangelists entry at .debug_rnglists"
            " offset 0x%x" ,dataoffset);
        dwarfstring_append_printf_u(&m,
            " has code 0x%x which is unknown",code);
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/

        Dwarf_Unsigned sectionsize = dbg->de_debug_rnglists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The end of an rle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The number of bytes in a single "
                "rnglist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }

    *bytes_count_out = (unsigned int)count;
    *entry_kind = code;
    *entry_operand1 = val1;
    *entry_operand2 = val2;
    return DW_DLV_OK;
}